

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

Node<QTabBar_*,_QHashDummyValue> * __thiscall
QHashPrivate::Span<QHashPrivate::Node<QTabBar_*,_QHashDummyValue>_>::insert
          (Span<QHashPrivate::Node<QTabBar_*,_QHashDummyValue>_> *this,size_t i)

{
  byte bVar1;
  uchar *puVar2;
  Node<QTabBar_*,_QHashDummyValue> *pNVar3;
  long in_RSI;
  long in_RDI;
  Span<QHashPrivate::Node<QTabBar_*,_QHashDummyValue>_> *unaff_retaddr;
  uchar entry;
  
  if (*(char *)(in_RDI + 0x89) == *(char *)(in_RDI + 0x88)) {
    addStorage(unaff_retaddr);
  }
  bVar1 = *(byte *)(in_RDI + 0x89);
  puVar2 = Entry::nextFree((Entry *)(*(long *)(in_RDI + 0x80) + (ulong)bVar1 * 8));
  *(uchar *)(in_RDI + 0x89) = *puVar2;
  *(byte *)(in_RDI + in_RSI) = bVar1;
  pNVar3 = Entry::node((Entry *)(*(long *)(in_RDI + 0x80) + (ulong)bVar1 * 8));
  return pNVar3;
}

Assistant:

Node *insert(size_t i)
    {
        Q_ASSERT(i < SpanConstants::NEntries);
        Q_ASSERT(offsets[i] == SpanConstants::UnusedEntry);
        if (nextFree == allocated)
            addStorage();
        unsigned char entry = nextFree;
        Q_ASSERT(entry < allocated);
        nextFree = entries[entry].nextFree();
        offsets[i] = entry;
        return &entries[entry].node();
    }